

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Subtract_DoubleHelper
              (Var subLeft,double dblRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var aRight_00;
  double dVar2;
  Var aRight;
  double sum_1;
  double sum;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  double dblRight_local;
  Var subLeft_local;
  
  bVar1 = TaggedInt::Is(subLeft);
  if (bVar1) {
    dVar2 = TaggedInt::ToDouble(subLeft);
    subLeft_local = JavascriptNumber::ToVarMaybeInPlace(dVar2 - dblRight,scriptContext,result);
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(subLeft);
    if (bVar1) {
      dVar2 = JavascriptNumber::GetValue(subLeft);
      subLeft_local = JavascriptNumber::ToVarMaybeInPlace(dVar2 - dblRight,scriptContext,result);
    }
    else {
      aRight_00 = JavascriptNumber::ToVarMaybeInPlace(dblRight,scriptContext,result);
      subLeft_local = Subtract_Full(subLeft,aRight_00,scriptContext);
    }
  }
  return subLeft_local;
}

Assistant:

Var inline JavascriptMath::Subtract_DoubleHelper(Var subLeft, double dblRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(subLeft))
            {
                double sum =  TaggedInt::ToDouble(subLeft) - dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(subLeft))
            {
                double sum = JavascriptNumber::GetValue(subLeft) - dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aRight = JavascriptNumber::ToVarMaybeInPlace(dblRight, scriptContext, result);

                return Subtract_Full(subLeft, aRight, scriptContext);
            }
        }